

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O3

class_<anurbs::NurbsSurfaceGeometry<3L>,_anurbs::SurfaceBase<3L>,_std::shared_ptr<anurbs::NurbsSurfaceGeometry<3L>_>_>
* __thiscall
pybind11::
class_<anurbs::NurbsSurfaceGeometry<3l>,anurbs::SurfaceBase<3l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<3l>>>
::
def<std::pair<std::vector<long,std::allocator<long>>,Eigen::Matrix<double,_1,_1,1,_1,_1>>(anurbs::NurbsSurfaceGeometry<3l>::*)(double,double,long,long,long)const,pybind11::arg,pybind11::arg,pybind11::arg,pybind11::arg,pybind11::arg>
          (class_<anurbs::NurbsSurfaceGeometry<3l>,anurbs::SurfaceBase<3l>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<3l>>>
           *this,char *name_,offset_in_Model_to_subr *f,arg *extra,arg *extra_1,arg *extra_2,
          arg *extra_3,arg *extra_4)

{
  offset_in_Model_to_subr f_00;
  name *extra_00;
  handle obj;
  undefined1 key [8];
  undefined1 local_80 [8];
  cpp_function cf;
  handle local_70;
  object local_68;
  object local_60;
  arg *local_58;
  is_method local_50;
  PyObject *local_48;
  object local_40;
  object local_38;
  
  f_00 = *f;
  extra_00 = (name *)f[1];
  local_60.super_handle.m_ptr = *(handle *)this;
  local_68.super_handle.m_ptr = (handle)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  local_58 = extra;
  local_50.class_.m_ptr = (handle)(handle)name_;
  local_70.m_ptr = (PyObject *)PyObject_GetAttrString();
  if (local_70.m_ptr == (PyObject *)0x0) {
    PyErr_Clear();
    local_70.m_ptr = (PyObject *)&_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 1;
  }
  local_80 = (undefined1  [8])local_70.m_ptr;
  cpp_function::
  cpp_function<std::pair<std::vector<long,std::allocator<long>>,Eigen::Matrix<double,_1,_1,1,_1,_1>>,anurbs::NurbsSurfaceGeometry<3l>,double,double,long,long,long,pybind11::name,pybind11::is_method,pybind11::sibling,pybind11::arg,pybind11::arg,pybind11::arg,pybind11::arg,pybind11::arg>
            (&cf,f_00,extra_00,&local_50,(sibling *)&local_60,(arg *)local_80,local_58,extra_1,
             extra_2,extra_3);
  object::~object((object *)&local_70);
  object::~object(&local_68);
  cpp_function::name((cpp_function *)local_80);
  key = local_80;
  obj.m_ptr = *(PyObject **)this;
  if (local_80 != (undefined1  [8])0x0) {
    *(Py_ssize_t *)local_80 = *(Py_ssize_t *)local_80 + 1;
  }
  local_40.super_handle.m_ptr = (handle)(handle)local_80;
  local_60.super_handle.m_ptr = (handle)(PyObject *)0x0;
  local_38.super_handle.m_ptr = (handle)(PyObject *)0x0;
  local_48 = obj.m_ptr;
  object::~object(&local_60);
  detail::accessor_policies::obj_attr::set
            (obj,(handle)key,(handle)cf.super_function.super_object.super_handle.m_ptr);
  object::~object(&local_38);
  object::~object(&local_40);
  object::~object((object *)local_80);
  object::~object((object *)&cf);
  return (class_<anurbs::NurbsSurfaceGeometry<3L>,_anurbs::SurfaceBase<3L>,_std::shared_ptr<anurbs::NurbsSurfaceGeometry<3L>_>_>
          *)this;
}

Assistant:

class_ &def(const char *name_, Func&& f, const Extra&... extra) {
        cpp_function cf(method_adaptor<type>(std::forward<Func>(f)), name(name_), is_method(*this),
                        sibling(getattr(*this, name_, none())), extra...);
        attr(cf.name()) = cf;
        return *this;
    }